

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  int iVar23;
  undefined4 uVar24;
  size_t sVar25;
  undefined8 uVar26;
  Scene *pSVar27;
  Geometry *pGVar28;
  long lVar29;
  long lVar30;
  RTCFilterFunctionN p_Var31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar38;
  int iVar39;
  undefined4 uVar40;
  AABBNodeMB4D *node1;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar54;
  size_t sVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar68;
  float fVar69;
  float fVar76;
  float fVar78;
  undefined1 auVar71 [16];
  float fVar70;
  float fVar77;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar96;
  float fVar97;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar92;
  float fVar98;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  float fVar104;
  float fVar105;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar106;
  undefined1 auVar103 [16];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar112;
  float fVar113;
  float fVar114;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  uint uVar129;
  float fVar130;
  uint uVar131;
  float fVar132;
  uint uVar133;
  float fVar134;
  uint uVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  int iVar157;
  int iVar158;
  int iVar159;
  undefined1 local_1258 [8];
  float fStack_1250;
  undefined4 uStack_124c;
  float fStack_1230;
  float fStack_122c;
  vbool<4> valid;
  Scene *scene;
  undefined1 local_1208 [16];
  undefined1 (*local_11f0) [16];
  ulong local_11e8;
  size_t local_11e0;
  ulong local_11d8;
  ulong local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1188;
  undefined8 uStack_1180;
  vfloat<4> tNear;
  float local_1118 [4];
  undefined1 local_1108 [16];
  float local_10f8 [4];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  float local_10c8 [4];
  int local_10b8;
  int iStack_10b4;
  int iStack_10b0;
  int iStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined8 local_1048;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  size_t sVar44;
  
  pSVar54 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar56 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar107 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar139 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar142 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar69 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar70 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar46 = uVar53 ^ 0x10;
  iVar39 = (tray->tnear).field_0.i[k];
  iVar157 = (tray->tfar).field_0.i[k];
  auVar85._4_4_ = iVar157;
  auVar85._0_4_ = iVar157;
  auVar85._8_4_ = iVar157;
  auVar85._12_4_ = iVar157;
  local_11f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1058 = fVar56;
  fStack_1054 = fVar56;
  fStack_1050 = fVar56;
  fStack_104c = fVar56;
  local_1068 = fVar107;
  fStack_1064 = fVar107;
  fStack_1060 = fVar107;
  fStack_105c = fVar107;
  local_1078 = fVar139;
  fStack_1074 = fVar139;
  fStack_1070 = fVar139;
  fStack_106c = fVar139;
  local_1088 = fVar142;
  fStack_1084 = fVar142;
  fStack_1080 = fVar142;
  fStack_107c = fVar142;
  local_1098 = fVar69;
  fStack_1094 = fVar69;
  fStack_1090 = fVar69;
  fStack_108c = fVar69;
  local_10a8 = fVar70;
  fStack_10a4 = fVar70;
  fStack_10a0 = fVar70;
  fStack_109c = fVar70;
  local_10b8 = iVar39;
  iStack_10b4 = iVar39;
  iStack_10b0 = iVar39;
  iStack_10ac = iVar39;
  sVar44 = k;
  fVar76 = fVar56;
  fVar77 = fVar56;
  fVar78 = fVar56;
  fVar79 = fVar107;
  fVar80 = fVar107;
  fVar81 = fVar107;
  fVar113 = fVar139;
  fVar117 = fVar139;
  fVar89 = fVar139;
  fVar96 = fVar142;
  fVar97 = fVar142;
  fVar98 = fVar142;
  fVar99 = fVar69;
  fVar104 = fVar69;
  fVar105 = fVar69;
  fVar106 = fVar70;
  fVar114 = fVar70;
  fVar118 = fVar70;
  iVar157 = iVar39;
  iVar158 = iVar39;
  iVar159 = iVar39;
  local_11e8 = uVar53;
LAB_006f790a:
  do {
    do {
      if (pSVar54 == stack) {
        return;
      }
      pSVar38 = pSVar54 + -1;
      pSVar54 = pSVar54 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar38->dist &&
             (float)pSVar38->dist != *(float *)(ray + k * 4 + 0x80));
    sVar55 = (pSVar54->ptr).ptr;
    while ((sVar55 & 8) == 0) {
      uVar41 = sVar55 & 0xfffffffffffffff0;
      fVar119 = *(float *)(ray + k * 4 + 0x70);
      pfVar22 = (float *)(uVar41 + 0x80 + uVar53);
      pfVar21 = (float *)(uVar41 + 0x20 + uVar53);
      auVar90._0_4_ = ((*pfVar22 * fVar119 + *pfVar21) - fVar56) * fVar142;
      auVar90._4_4_ = ((pfVar22[1] * fVar119 + pfVar21[1]) - fVar76) * fVar96;
      auVar90._8_4_ = ((pfVar22[2] * fVar119 + pfVar21[2]) - fVar77) * fVar97;
      auVar90._12_4_ = ((pfVar22[3] * fVar119 + pfVar21[3]) - fVar78) * fVar98;
      auVar82._4_4_ = iVar157;
      auVar82._0_4_ = iVar39;
      auVar82._8_4_ = iVar158;
      auVar82._12_4_ = iVar159;
      auVar82 = maxps(auVar82,auVar90);
      pfVar22 = (float *)(uVar41 + 0x80 + uVar47);
      pfVar21 = (float *)(uVar41 + 0x20 + uVar47);
      auVar110._0_4_ = ((*pfVar22 * fVar119 + *pfVar21) - fVar107) * fVar69;
      auVar110._4_4_ = ((pfVar22[1] * fVar119 + pfVar21[1]) - fVar79) * fVar99;
      auVar110._8_4_ = ((pfVar22[2] * fVar119 + pfVar21[2]) - fVar80) * fVar104;
      auVar110._12_4_ = ((pfVar22[3] * fVar119 + pfVar21[3]) - fVar81) * fVar105;
      pfVar22 = (float *)(uVar41 + 0x80 + uVar45);
      pfVar21 = (float *)(uVar41 + 0x20 + uVar45);
      auVar111._0_4_ = ((*pfVar22 * fVar119 + *pfVar21) - fVar139) * fVar70;
      auVar111._4_4_ = ((pfVar22[1] * fVar119 + pfVar21[1]) - fVar113) * fVar106;
      auVar111._8_4_ = ((pfVar22[2] * fVar119 + pfVar21[2]) - fVar117) * fVar114;
      auVar111._12_4_ = ((pfVar22[3] * fVar119 + pfVar21[3]) - fVar89) * fVar118;
      auVar90 = maxps(auVar110,auVar111);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar82,auVar90);
      pfVar22 = (float *)(uVar41 + 0x80 + uVar46);
      pfVar21 = (float *)(uVar41 + 0x20 + uVar46);
      auVar116._0_4_ = ((*pfVar22 * fVar119 + *pfVar21) - fVar56) * fVar142;
      auVar116._4_4_ = ((pfVar22[1] * fVar119 + pfVar21[1]) - fVar76) * fVar96;
      auVar116._8_4_ = ((pfVar22[2] * fVar119 + pfVar21[2]) - fVar77) * fVar97;
      auVar116._12_4_ = ((pfVar22[3] * fVar119 + pfVar21[3]) - fVar78) * fVar98;
      auVar82 = minps(auVar85,auVar116);
      pfVar22 = (float *)(uVar41 + 0x80 + (uVar47 ^ 0x10));
      pfVar21 = (float *)(uVar41 + 0x20 + (uVar47 ^ 0x10));
      auVar100._0_4_ = ((*pfVar22 * fVar119 + *pfVar21) - fVar107) * fVar69;
      auVar100._4_4_ = ((pfVar22[1] * fVar119 + pfVar21[1]) - fVar79) * fVar99;
      auVar100._8_4_ = ((pfVar22[2] * fVar119 + pfVar21[2]) - fVar80) * fVar104;
      auVar100._12_4_ = ((pfVar22[3] * fVar119 + pfVar21[3]) - fVar81) * fVar105;
      pfVar22 = (float *)(uVar41 + 0x80 + (uVar45 ^ 0x10));
      pfVar21 = (float *)(uVar41 + 0x20 + (uVar45 ^ 0x10));
      auVar108._0_4_ = ((*pfVar22 * fVar119 + *pfVar21) - fVar139) * fVar70;
      auVar108._4_4_ = ((pfVar22[1] * fVar119 + pfVar21[1]) - fVar113) * fVar106;
      auVar108._8_4_ = ((pfVar22[2] * fVar119 + pfVar21[2]) - fVar117) * fVar114;
      auVar108._12_4_ = ((pfVar22[3] * fVar119 + pfVar21[3]) - fVar89) * fVar118;
      auVar90 = minps(auVar100,auVar108);
      auVar82 = minps(auVar82,auVar90);
      if (((uint)sVar55 & 7) == 6) {
        bVar32 = (fVar119 < *(float *)(uVar41 + 0xf0) && *(float *)(uVar41 + 0xe0) <= fVar119) &&
                 tNear.field_0._0_4_ <= auVar82._0_4_;
        bVar33 = (fVar119 < *(float *)(uVar41 + 0xf4) && *(float *)(uVar41 + 0xe4) <= fVar119) &&
                 tNear.field_0._4_4_ <= auVar82._4_4_;
        bVar34 = (fVar119 < *(float *)(uVar41 + 0xf8) && *(float *)(uVar41 + 0xe8) <= fVar119) &&
                 tNear.field_0._8_4_ <= auVar82._8_4_;
        bVar35 = (fVar119 < *(float *)(uVar41 + 0xfc) && *(float *)(uVar41 + 0xec) <= fVar119) &&
                 tNear.field_0._12_4_ <= auVar82._12_4_;
      }
      else {
        bVar32 = tNear.field_0._0_4_ <= auVar82._0_4_;
        bVar33 = tNear.field_0._4_4_ <= auVar82._4_4_;
        bVar34 = tNear.field_0._8_4_ <= auVar82._8_4_;
        bVar35 = tNear.field_0._12_4_ <= auVar82._12_4_;
      }
      auVar57._0_4_ = (uint)bVar32 * -0x80000000;
      auVar57._4_4_ = (uint)bVar33 * -0x80000000;
      auVar57._8_4_ = (uint)bVar34 * -0x80000000;
      auVar57._12_4_ = (uint)bVar35 * -0x80000000;
      uVar43 = movmskps((int)sVar44,auVar57);
      sVar44 = (size_t)uVar43;
      if (uVar43 == 0) goto LAB_006f790a;
      sVar44 = 0;
      if ((byte)uVar43 != 0) {
        for (; ((byte)uVar43 >> sVar44 & 1) == 0; sVar44 = sVar44 + 1) {
        }
      }
      sVar55 = *(size_t *)(uVar41 + sVar44 * 8);
      uVar43 = (uVar43 & 0xff) - 1 & uVar43 & 0xff;
      if (uVar43 != 0) {
        uVar129 = tNear.field_0.i[sVar44];
        lVar48 = 0;
        if (uVar43 != 0) {
          for (; (uVar43 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
          }
        }
        sVar25 = *(size_t *)(uVar41 + lVar48 * 8);
        uVar131 = tNear.field_0.i[lVar48];
        uVar43 = uVar43 - 1 & uVar43;
        sVar44 = (size_t)uVar43;
        if (uVar43 == 0) {
          if (uVar129 < uVar131) {
            (pSVar54->ptr).ptr = sVar25;
            pSVar54->dist = uVar131;
            pSVar54 = pSVar54 + 1;
          }
          else {
            (pSVar54->ptr).ptr = sVar55;
            pSVar54->dist = uVar129;
            pSVar54 = pSVar54 + 1;
            sVar55 = sVar25;
          }
        }
        else {
          auVar83._8_4_ = uVar129;
          auVar83._0_8_ = sVar55;
          auVar83._12_4_ = 0;
          auVar101._8_4_ = uVar131;
          auVar101._0_8_ = sVar25;
          auVar101._12_4_ = 0;
          lVar48 = 0;
          if (sVar44 != 0) {
            for (; (uVar43 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
            }
          }
          uVar26 = *(undefined8 *)(uVar41 + lVar48 * 8);
          iVar23 = tNear.field_0.i[lVar48];
          auVar91._8_4_ = iVar23;
          auVar91._0_8_ = uVar26;
          auVar91._12_4_ = 0;
          auVar58._8_4_ = -(uint)((int)uVar129 < (int)uVar131);
          uVar43 = uVar43 - 1 & uVar43;
          if (uVar43 == 0) {
            auVar58._4_4_ = auVar58._8_4_;
            auVar58._0_4_ = auVar58._8_4_;
            auVar58._12_4_ = auVar58._8_4_;
            auVar109._8_4_ = uVar131;
            auVar109._0_8_ = sVar25;
            auVar109._12_4_ = 0;
            auVar110 = blendvps(auVar109,auVar83,auVar58);
            auVar82 = blendvps(auVar83,auVar101,auVar58);
            auVar59._8_4_ = -(uint)(auVar110._8_4_ < iVar23);
            auVar59._4_4_ = auVar59._8_4_;
            auVar59._0_4_ = auVar59._8_4_;
            auVar59._12_4_ = auVar59._8_4_;
            auVar102._8_4_ = iVar23;
            auVar102._0_8_ = uVar26;
            auVar102._12_4_ = 0;
            auVar90 = blendvps(auVar102,auVar110,auVar59);
            auVar110 = blendvps(auVar110,auVar91,auVar59);
            auVar60._8_4_ = -(uint)(auVar82._8_4_ < auVar110._8_4_);
            auVar60._4_4_ = auVar60._8_4_;
            auVar60._0_4_ = auVar60._8_4_;
            auVar60._12_4_ = auVar60._8_4_;
            SVar92 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar110,auVar82,auVar60);
            SVar84 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar82,auVar110,auVar60);
            *pSVar54 = SVar84;
            pSVar54[1] = SVar92;
            sVar55 = auVar90._0_8_;
            pSVar54 = pSVar54 + 2;
          }
          else {
            sVar44 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> sVar44 & 1) == 0; sVar44 = sVar44 + 1) {
              }
            }
            auVar61._4_4_ = auVar58._8_4_;
            auVar61._0_4_ = auVar58._8_4_;
            auVar61._8_4_ = auVar58._8_4_;
            auVar61._12_4_ = auVar58._8_4_;
            auVar111 = blendvps(auVar101,auVar83,auVar61);
            auVar82 = blendvps(auVar83,auVar101,auVar61);
            auVar115._8_4_ = tNear.field_0.i[sVar44];
            auVar115._0_8_ = *(undefined8 *)(uVar41 + sVar44 * 8);
            auVar115._12_4_ = 0;
            auVar62._8_4_ = -(uint)(iVar23 < tNear.field_0.i[sVar44]);
            auVar62._4_4_ = auVar62._8_4_;
            auVar62._0_4_ = auVar62._8_4_;
            auVar62._12_4_ = auVar62._8_4_;
            auVar110 = blendvps(auVar115,auVar91,auVar62);
            auVar90 = blendvps(auVar91,auVar115,auVar62);
            auVar63._8_4_ = -(uint)(auVar82._8_4_ < auVar90._8_4_);
            auVar63._4_4_ = auVar63._8_4_;
            auVar63._0_4_ = auVar63._8_4_;
            auVar63._12_4_ = auVar63._8_4_;
            auVar116 = blendvps(auVar90,auVar82,auVar63);
            SVar84 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar82,auVar90,auVar63);
            auVar64._8_4_ = -(uint)(auVar111._8_4_ < auVar110._8_4_);
            auVar64._4_4_ = auVar64._8_4_;
            auVar64._0_4_ = auVar64._8_4_;
            auVar64._12_4_ = auVar64._8_4_;
            auVar82 = blendvps(auVar110,auVar111,auVar64);
            auVar90 = blendvps(auVar111,auVar110,auVar64);
            auVar65._8_4_ = -(uint)(auVar90._8_4_ < auVar116._8_4_);
            auVar65._4_4_ = auVar65._8_4_;
            auVar65._0_4_ = auVar65._8_4_;
            auVar65._12_4_ = auVar65._8_4_;
            SVar92 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar116,auVar90,auVar65);
            SVar112 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar90,auVar116,auVar65);
            *pSVar54 = SVar84;
            pSVar54[1] = SVar112;
            pSVar54[2] = SVar92;
            sVar55 = auVar82._0_8_;
            pSVar54 = pSVar54 + 3;
          }
        }
      }
    }
    local_11e0 = (ulong)((uint)sVar55 & 0xf) - 8;
    uVar41 = sVar55 & 0xfffffffffffffff0;
    sVar55 = 0;
    while (sVar55 != local_11e0) {
      lVar48 = sVar55 * 0x50;
      pSVar27 = context->scene;
      pGVar28 = (pSVar27->geometries).items[*(uint *)(uVar41 + 0x30 + lVar48)].ptr;
      fVar56 = (pGVar28->time_range).lower;
      fVar107 = ((*(float *)(ray + k * 4 + 0x70) - fVar56) / ((pGVar28->time_range).upper - fVar56))
                * pGVar28->fnumTimeSegments;
      auVar71 = roundss(ZEXT416((uint)fVar56),ZEXT416((uint)fVar107),9);
      fVar56 = pGVar28->fnumTimeSegments + -1.0;
      if (fVar56 <= auVar71._0_4_) {
        auVar71._0_4_ = fVar56;
      }
      fVar56 = 0.0;
      if (0.0 <= auVar71._0_4_) {
        fVar56 = auVar71._0_4_;
      }
      uVar52 = (ulong)*(uint *)(uVar41 + 4 + lVar48);
      lVar29 = *(long *)(*(long *)&pGVar28[2].numPrimitives + (long)(int)fVar56 * 0x38);
      lVar30 = *(long *)(*(long *)&pGVar28[2].numPrimitives + 0x38 + (long)(int)fVar56 * 0x38);
      pfVar21 = (float *)(lVar29 + (ulong)*(uint *)(uVar41 + lVar48) * 4);
      uVar42 = (ulong)*(uint *)(uVar41 + 0x10 + lVar48);
      pfVar22 = (float *)(lVar29 + uVar42 * 4);
      uVar49 = (ulong)*(uint *)(uVar41 + 0x20 + lVar48);
      puVar1 = (undefined8 *)(lVar29 + uVar49 * 4);
      uVar26 = *puVar1;
      pfVar2 = (float *)(lVar29 + uVar52 * 4);
      local_11c8 = (ulong)*(uint *)(uVar41 + 0x14 + lVar48);
      pfVar3 = (float *)(lVar29 + local_11c8 * 4);
      uVar43 = *(uint *)(uVar41 + 0x24 + lVar48);
      pfVar4 = (float *)(lVar29 + (ulong)uVar43 * 4);
      uVar50 = (ulong)*(uint *)(uVar41 + 8 + lVar48);
      local_11d8 = (ulong)*(uint *)(uVar41 + 0x18 + lVar48);
      pfVar5 = (float *)(lVar29 + local_11d8 * 4);
      local_11c0 = (ulong)*(uint *)(uVar41 + 0x28 + lVar48);
      pfVar6 = (float *)(lVar29 + local_11c0 * 4);
      uVar51 = (ulong)*(uint *)(uVar41 + 0xc + lVar48);
      local_11d0 = (ulong)*(uint *)(uVar41 + 0x1c + lVar48);
      pfVar7 = (float *)(lVar29 + local_11d0 * 4);
      uVar53 = (ulong)*(uint *)(uVar41 + 0x2c + lVar48);
      pfVar8 = (float *)(lVar29 + uVar53 * 4);
      pfVar9 = (float *)(lVar30 + (ulong)*(uint *)(uVar41 + lVar48) * 4);
      pfVar10 = (float *)(lVar30 + uVar42 * 4);
      fVar107 = fVar107 - fVar56;
      pfVar11 = (float *)(lVar30 + uVar52 * 4);
      pfVar12 = (float *)(lVar30 + uVar50 * 4);
      local_1028 = pfVar22[2];
      fStack_1024 = pfVar3[2];
      fStack_1020 = pfVar5[2];
      fStack_101c = pfVar7[2];
      local_1258._0_4_ = (undefined4)uVar26;
      local_1258._4_4_ = (undefined4)((ulong)uVar26 >> 0x20);
      fStack_1250 = (float)puVar1[1];
      pfVar13 = (float *)(lVar30 + uVar51 * 4);
      local_1048 = CONCAT44(*pfVar4,local_1258._0_4_);
      _local_1038 = CONCAT44(*pfVar8,*pfVar6);
      pfVar14 = (float *)(lVar30 + local_11d8 * 4);
      pfVar15 = (float *)(lVar30 + local_11c8 * 4);
      pfVar16 = (float *)(lVar30 + local_11d0 * 4);
      pfVar17 = (float *)(lVar30 + uVar49 * 4);
      pfVar18 = (float *)(lVar30 + local_11c0 * 4);
      pfVar19 = (float *)(lVar30 + (ulong)uVar43 * 4);
      pfVar20 = (float *)(lVar30 + uVar53 * 4);
      fVar56 = 1.0 - fVar107;
      fVar113 = *pfVar21 * fVar56 + *pfVar9 * fVar107;
      fVar117 = *pfVar2 * fVar56 + *pfVar11 * fVar107;
      fVar119 = fStack_1230 * fVar56 + *pfVar12 * fVar107;
      fVar121 = fStack_122c * fVar56 + *pfVar13 * fVar107;
      fVar69 = pfVar21[1] * fVar56 + pfVar9[1] * fVar107;
      fVar76 = pfVar2[1] * fVar56 + pfVar11[1] * fVar107;
      fVar78 = *(float *)(lVar29 + uVar50 * 4 + 4) * fVar56 + pfVar12[1] * fVar107;
      fVar80 = *(float *)(lVar29 + uVar51 * 4 + 4) * fVar56 + pfVar13[1] * fVar107;
      fVar114 = *pfVar6 * fVar56 + pfVar9[2] * fVar107;
      fVar118 = *pfVar8 * fVar56 + pfVar11[2] * fVar107;
      fVar120 = fStack_1030 * fVar56 + pfVar12[2] * fVar107;
      fVar122 = fStack_102c * fVar56 + pfVar13[2] * fVar107;
      puVar1 = (undefined8 *)(uVar41 + 0x30 + lVar48);
      local_1018 = *puVar1;
      uStack_1010 = puVar1[1];
      puVar1 = (undefined8 *)(uVar41 + 0x40 + lVar48);
      local_1188 = *puVar1;
      uStack_1180 = puVar1[1];
      fVar89 = fVar113 - (*pfVar22 * fVar56 + *pfVar10 * fVar107);
      fVar96 = fVar117 - (*pfVar3 * fVar56 + *pfVar15 * fVar107);
      fVar97 = fVar119 - (*pfVar5 * fVar56 + *pfVar14 * fVar107);
      fVar98 = fVar121 - (*pfVar7 * fVar56 + *pfVar16 * fVar107);
      fVar140 = fVar69 - (pfVar22[1] * fVar56 + pfVar10[1] * fVar107);
      fVar143 = fVar76 - (pfVar3[1] * fVar56 + pfVar15[1] * fVar107);
      fVar145 = fVar78 - (pfVar5[1] * fVar56 + pfVar14[1] * fVar107);
      fVar147 = fVar80 - (pfVar7[1] * fVar56 + pfVar16[1] * fVar107);
      fVar149 = fVar114 - (pfVar22[2] * fVar56 + pfVar10[2] * fVar107);
      fVar150 = fVar118 - (pfVar3[2] * fVar56 + pfVar15[2] * fVar107);
      fVar151 = fVar120 - (pfVar5[2] * fVar56 + pfVar14[2] * fVar107);
      fVar152 = fVar122 - (pfVar7[2] * fVar56 + pfVar16[2] * fVar107);
      fVar70 = ((float)local_1258._0_4_ * fVar56 + *pfVar17 * fVar107) - fVar113;
      fVar77 = (*pfVar4 * fVar56 + *pfVar19 * fVar107) - fVar117;
      fVar79 = (fStack_1040 * fVar56 + *pfVar18 * fVar107) - fVar119;
      fVar81 = (fStack_103c * fVar56 + *pfVar20 * fVar107) - fVar121;
      fVar99 = ((float)local_1258._4_4_ * fVar56 + pfVar17[1] * fVar107) - fVar69;
      fVar104 = (pfVar4[1] * fVar56 + pfVar19[1] * fVar107) - fVar76;
      fVar105 = (pfVar6[1] * fVar56 + pfVar18[1] * fVar107) - fVar78;
      fVar106 = (pfVar8[1] * fVar56 + pfVar20[1] * fVar107) - fVar80;
      fVar128 = (fVar56 * fStack_1250 + fVar107 * pfVar17[2]) - fVar114;
      fVar130 = (fVar56 * pfVar4[2] + fVar107 * pfVar19[2]) - fVar118;
      fVar132 = (fVar56 * pfVar6[2] + fVar107 * pfVar18[2]) - fVar120;
      fVar134 = (fVar56 * pfVar8[2] + fVar107 * pfVar20[2]) - fVar122;
      fVar123 = fVar149 * fVar99 - fVar140 * fVar128;
      fVar124 = fVar150 * fVar104 - fVar143 * fVar130;
      local_10e8._4_4_ = fVar124;
      local_10e8._0_4_ = fVar123;
      fVar125 = fVar151 * fVar105 - fVar145 * fVar132;
      fVar126 = fVar152 * fVar106 - fVar147 * fVar134;
      fVar56 = *(float *)(ray + k * 4);
      fVar107 = *(float *)(ray + k * 4 + 0x10);
      fVar139 = *(float *)(ray + k * 4 + 0x40);
      fVar142 = *(float *)(ray + k * 4 + 0x50);
      fVar113 = fVar113 - fVar56;
      fVar117 = fVar117 - fVar56;
      fStack_1230 = fVar119 - fVar56;
      fStack_122c = fVar121 - fVar56;
      fVar69 = fVar69 - fVar107;
      fVar76 = fVar76 - fVar107;
      fVar78 = fVar78 - fVar107;
      fVar80 = fVar80 - fVar107;
      fVar153 = fVar113 * fVar142 - fVar69 * fVar139;
      fVar154 = fVar117 * fVar142 - fVar76 * fVar139;
      fVar155 = fStack_1230 * fVar142 - fVar78 * fVar139;
      fVar156 = fStack_122c * fVar142 - fVar80 * fVar139;
      local_10d8._0_4_ = fVar89 * fVar128 - fVar149 * fVar70;
      local_10d8._4_4_ = fVar96 * fVar130 - fVar150 * fVar77;
      local_10d8._8_4_ = fVar97 * fVar132 - fVar151 * fVar79;
      local_10d8._12_4_ = fVar98 * fVar134 - fVar152 * fVar81;
      fVar56 = *(float *)(ray + k * 4 + 0x20);
      fVar107 = *(float *)(ray + k * 4 + 0x60);
      fVar114 = fVar114 - fVar56;
      fVar118 = fVar118 - fVar56;
      fVar120 = fVar120 - fVar56;
      fVar122 = fVar122 - fVar56;
      local_10e8._8_4_ = fVar125;
      local_10e8._12_4_ = fVar126;
      fVar56 = fVar114 * fVar139 - fVar113 * fVar107;
      fVar119 = fVar118 * fVar139 - fVar117 * fVar107;
      fVar121 = fVar120 * fVar139 - fStack_1230 * fVar107;
      fVar127 = fVar122 * fVar139 - fStack_122c * fVar107;
      local_10c8[0] = fVar140 * fVar70 - fVar89 * fVar99;
      local_10c8[1] = fVar143 * fVar77 - fVar96 * fVar104;
      local_10c8[2] = fVar145 * fVar79 - fVar97 * fVar105;
      local_10c8[3] = fVar147 * fVar81 - fVar98 * fVar106;
      fVar141 = fVar69 * fVar107 - fVar114 * fVar142;
      fVar144 = fVar76 * fVar107 - fVar118 * fVar142;
      fVar146 = fVar78 * fVar107 - fVar120 * fVar142;
      fVar148 = fVar80 * fVar107 - fVar122 * fVar142;
      fVar136 = fVar139 * fVar123 + fVar142 * local_10d8._0_4_ + fVar107 * local_10c8[0];
      fVar137 = fVar139 * fVar124 + fVar142 * local_10d8._4_4_ + fVar107 * local_10c8[1];
      fVar138 = fVar139 * fVar125 + fVar142 * local_10d8._8_4_ + fVar107 * local_10c8[2];
      fVar139 = fVar139 * fVar126 + fVar142 * local_10d8._12_4_ + fVar107 * local_10c8[3];
      uVar129 = (uint)fVar136 & 0x80000000;
      uVar131 = (uint)fVar137 & 0x80000000;
      uVar133 = (uint)fVar138 & 0x80000000;
      uVar135 = (uint)fVar139 & 0x80000000;
      tNear.field_0.i[0] = (uint)(fVar70 * fVar141 + fVar99 * fVar56 + fVar128 * fVar153) ^ uVar129;
      tNear.field_0.i[1] =
           (uint)(fVar77 * fVar144 + fVar104 * fVar119 + fVar130 * fVar154) ^ uVar131;
      tNear.field_0.i[2] =
           (uint)(fVar79 * fVar146 + fVar105 * fVar121 + fVar132 * fVar155) ^ uVar133;
      tNear.field_0.i[3] =
           (uint)(fVar81 * fVar148 + fVar106 * fVar127 + fVar134 * fVar156) ^ uVar135;
      fVar142 = (float)((uint)(fVar141 * fVar89 + fVar56 * fVar140 + fVar153 * fVar149) ^ uVar129);
      fVar70 = (float)((uint)(fVar144 * fVar96 + fVar119 * fVar143 + fVar154 * fVar150) ^ uVar131);
      fVar77 = (float)((uint)(fVar146 * fVar97 + fVar121 * fVar145 + fVar155 * fVar151) ^ uVar133);
      fVar79 = (float)((uint)(fVar148 * fVar98 + fVar127 * fVar147 + fVar156 * fVar152) ^ uVar135);
      fVar56 = ABS(fVar136);
      fVar107 = ABS(fVar137);
      auVar93._0_8_ = CONCAT44(fVar137,fVar136) & 0x7fffffff7fffffff;
      auVar93._8_4_ = ABS(fVar138);
      auVar93._12_4_ = ABS(fVar139);
      bVar34 = tNear.field_0.v[0] + fVar142 <= fVar56 &&
               ((0.0 <= fVar142 && 0.0 <= tNear.field_0.v[0]) && fVar136 != 0.0);
      auVar103._0_4_ = -(uint)bVar34;
      bVar35 = tNear.field_0.v[1] + fVar70 <= fVar107 &&
               ((0.0 <= fVar70 && 0.0 <= tNear.field_0.v[1]) && fVar137 != 0.0);
      auVar103._4_4_ = -(uint)bVar35;
      bVar33 = tNear.field_0.v[2] + fVar77 <= auVar93._8_4_ &&
               ((0.0 <= fVar77 && 0.0 <= tNear.field_0.v[2]) && fVar138 != 0.0);
      auVar103._8_4_ = -(uint)bVar33;
      bVar32 = tNear.field_0.v[3] + fVar79 <= auVar93._12_4_ &&
               ((0.0 <= fVar79 && 0.0 <= tNear.field_0.v[3]) && fVar139 != 0.0);
      auVar103._12_4_ = -(uint)bVar32;
      iVar39 = movmskps(uVar43,auVar103);
      if (iVar39 != 0) {
        fVar69 = (float)(uVar129 ^
                        (uint)(fVar113 * fVar123 +
                              fVar69 * local_10d8._0_4_ + fVar114 * local_10c8[0]));
        fVar76 = (float)(uVar131 ^
                        (uint)(fVar117 * fVar124 +
                              fVar76 * local_10d8._4_4_ + fVar118 * local_10c8[1]));
        fVar78 = (float)(uVar133 ^
                        (uint)(fStack_1230 * fVar125 +
                              fVar78 * local_10d8._8_4_ + fVar120 * local_10c8[2]));
        fVar80 = (float)(uVar135 ^
                        (uint)(fStack_122c * fVar126 +
                              fVar80 * local_10d8._12_4_ + fVar122 * local_10c8[3]));
        fVar139 = *(float *)(ray + k * 4 + 0x30);
        local_1258._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
        local_1258._4_4_ = 0;
        fStack_1250 = 0.0;
        uStack_124c = 0;
        valid.field_0.i[0] =
             -(uint)((fVar69 <= (float)local_1258._0_4_ * fVar56 && fVar139 * fVar56 < fVar69) &&
                    bVar34);
        valid.field_0.i[1] =
             -(uint)((fVar76 <= (float)local_1258._0_4_ * fVar107 && fVar139 * fVar107 < fVar76) &&
                    bVar35);
        valid.field_0.i[2] =
             -(uint)((fVar78 <= (float)local_1258._0_4_ * auVar93._8_4_ &&
                     fVar139 * auVar93._8_4_ < fVar78) && bVar33);
        valid.field_0.i[3] =
             -(uint)((fVar80 <= (float)local_1258._0_4_ * auVar93._12_4_ &&
                     fVar139 * auVar93._12_4_ < fVar80) && bVar32);
        iVar39 = movmskps(iVar39,(undefined1  [16])valid.field_0);
        if (iVar39 != 0) {
          auVar85 = rcpps(local_10e8,auVar93);
          fVar139 = auVar85._0_4_;
          fVar81 = auVar85._4_4_;
          fVar113 = auVar85._8_4_;
          fVar117 = auVar85._12_4_;
          fVar139 = (1.0 - fVar56 * fVar139) * fVar139 + fVar139;
          fVar81 = (1.0 - fVar107 * fVar81) * fVar81 + fVar81;
          fVar113 = (1.0 - auVar93._8_4_ * fVar113) * fVar113 + fVar113;
          fVar117 = (1.0 - auVar93._12_4_ * fVar117) * fVar117 + fVar117;
          fVar69 = fVar69 * fVar139;
          fVar76 = fVar76 * fVar81;
          fVar78 = fVar78 * fVar113;
          fVar80 = fVar80 * fVar117;
          local_10f8[0] = fVar69;
          local_10f8[1] = fVar76;
          local_10f8[2] = fVar78;
          local_10f8[3] = fVar80;
          local_1118[0] = tNear.field_0.v[0] * fVar139;
          local_1118[1] = tNear.field_0.v[1] * fVar81;
          local_1118[2] = tNear.field_0.v[2] * fVar113;
          local_1118[3] = tNear.field_0.v[3] * fVar117;
          local_1108._0_4_ = fVar139 * fVar142;
          local_1108._4_4_ = fVar81 * fVar70;
          local_1108._8_4_ = fVar113 * fVar77;
          local_1108._12_4_ = fVar117 * fVar79;
          auVar36._4_4_ = fVar76;
          auVar36._0_4_ = fVar69;
          auVar36._8_4_ = fVar78;
          auVar36._12_4_ = fVar80;
          auVar82 = blendvps(_DAT_01f45a30,auVar36,(undefined1  [16])valid.field_0);
          auVar94._4_4_ = auVar82._0_4_;
          auVar94._0_4_ = auVar82._4_4_;
          auVar94._8_4_ = auVar82._12_4_;
          auVar94._12_4_ = auVar82._8_4_;
          auVar85 = minps(auVar94,auVar82);
          auVar72._0_8_ = auVar85._8_8_;
          auVar72._8_4_ = auVar85._0_4_;
          auVar72._12_4_ = auVar85._4_4_;
          auVar85 = minps(auVar72,auVar85);
          uVar43 = -(uint)(auVar85._0_4_ == auVar82._0_4_);
          uVar129 = -(uint)(auVar85._4_4_ == auVar82._4_4_);
          uVar131 = -(uint)(auVar85._8_4_ == auVar82._8_4_);
          uVar133 = -(uint)(auVar85._12_4_ == auVar82._12_4_);
          auVar88._4_4_ = uVar129;
          auVar88._0_4_ = uVar43;
          auVar86._0_4_ = uVar43 & valid.field_0.i[0];
          auVar86._4_4_ = uVar129 & valid.field_0.i[1];
          auVar86._8_4_ = uVar131 & valid.field_0.i[2];
          auVar86._12_4_ = uVar133 & valid.field_0.i[3];
          iVar39 = movmskps(iVar39,auVar86);
          auVar87._8_4_ = 0xffffffff;
          auVar87._0_8_ = 0xffffffffffffffff;
          auVar87._12_4_ = 0xffffffff;
          if (iVar39 != 0) {
            auVar88._8_4_ = uVar131;
            auVar88._12_4_ = uVar133;
            auVar87 = auVar88;
          }
          auVar66._0_4_ = valid.field_0.i[0] & auVar87._0_4_;
          auVar66._4_4_ = valid.field_0.i[1] & auVar87._4_4_;
          auVar66._8_4_ = valid.field_0.i[2] & auVar87._8_4_;
          auVar66._12_4_ = valid.field_0.i[3] & auVar87._12_4_;
          uVar43 = movmskps(iVar39,auVar66);
          uVar53 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
            }
          }
LAB_006f82d7:
          uVar43 = *(uint *)((long)&local_1018 + uVar53 * 4);
          uVar42 = (ulong)uVar43;
          pGVar28 = (pSVar27->geometries).items[uVar42].ptr;
          if ((pGVar28->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            valid.field_0.v[uVar53] = 0.0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar28->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar56 = local_1118[uVar53];
              fVar107 = local_10f8[uVar53 - 4];
              *(float *)(ray + k * 4 + 0x80) = local_10f8[uVar53];
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10e8 + uVar53 * 4);
              *(float *)(ray + k * 4 + 0xd0) = local_10c8[uVar53 - 4];
              *(float *)(ray + k * 4 + 0xe0) = local_10c8[uVar53];
              *(float *)(ray + k * 4 + 0xf0) = fVar56;
              *(float *)(ray + k * 4 + 0x100) = fVar107;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_1188 + uVar53 * 4)
              ;
              *(uint *)(ray + k * 4 + 0x120) = uVar43;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              goto LAB_006f8158;
            }
            h.u.field_0.v[0] = local_1118[uVar53];
            h.v.field_0.v[0] = local_10f8[uVar53 - 4];
            uVar40 = *(undefined4 *)(local_10e8 + uVar53 * 4);
            fVar56 = local_10c8[uVar53 - 4];
            h.geomID.field_0.i[1] = uVar43;
            h.geomID.field_0.i[0] = uVar43;
            h.geomID.field_0.i[2] = uVar43;
            h.geomID.field_0.i[3] = uVar43;
            uVar24 = *(undefined4 *)((long)&local_1188 + uVar53 * 4);
            h.primID.field_0.i[1] = uVar24;
            h.primID.field_0.i[0] = uVar24;
            h.primID.field_0.i[2] = uVar24;
            h.primID.field_0.i[3] = uVar24;
            h.Ng.field_0._4_4_ = uVar40;
            h.Ng.field_0._0_4_ = uVar40;
            h.Ng.field_0._8_4_ = uVar40;
            h.Ng.field_0._12_4_ = uVar40;
            h.Ng.field_0._20_4_ = (int)fVar56;
            h.Ng.field_0._16_4_ = (int)fVar56;
            h.Ng.field_0._24_4_ = (int)fVar56;
            h.Ng.field_0._28_4_ = (int)fVar56;
            fVar56 = local_10c8[uVar53];
            h.Ng.field_0._36_4_ = (int)fVar56;
            h.Ng.field_0._32_4_ = (int)fVar56;
            h.Ng.field_0._40_4_ = (int)fVar56;
            h.Ng.field_0._44_4_ = (int)fVar56;
            h.u.field_0.v[1] = h.u.field_0.v[0];
            h.u.field_0.v[2] = h.u.field_0.v[0];
            h.u.field_0.v[3] = h.u.field_0.v[0];
            h.v.field_0.v[1] = h.v.field_0.v[0];
            h.v.field_0.v[2] = h.v.field_0.v[0];
            h.v.field_0.v[3] = h.v.field_0.v[0];
            h.instID[0].field_0.i[0] = context->user->instID[0];
            h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
            h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
            h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
            h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
            *(float *)(ray + k * 4 + 0x80) = local_10f8[uVar53];
            local_1208 = *local_11f0;
            args.valid = (int *)local_1208;
            args.geometryUserPtr = pGVar28->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&h;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (pGVar28->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar28->intersectionFilterN)(&args);
            }
            if (local_1208 == (undefined1  [16])0x0) {
              auVar73._8_4_ = 0xffffffff;
              auVar73._0_8_ = 0xffffffffffffffff;
              auVar73._12_4_ = 0xffffffff;
              auVar73 = auVar73 ^ _DAT_01f46b70;
            }
            else {
              p_Var31 = context->args->filter;
              if ((p_Var31 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar28->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var31)(&args);
              }
              auVar67._0_4_ = -(uint)(local_1208._0_4_ == 0);
              auVar67._4_4_ = -(uint)(local_1208._4_4_ == 0);
              auVar67._8_4_ = -(uint)(local_1208._8_4_ == 0);
              auVar67._12_4_ = -(uint)(local_1208._12_4_ == 0);
              auVar73 = auVar67 ^ _DAT_01f46b70;
              if (local_1208 != (undefined1  [16])0x0) {
                auVar85 = blendvps(*(undefined1 (*) [16])args.hit,
                                   *(undefined1 (*) [16])(args.ray + 0xc0),auVar67);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar85;
                auVar85 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                   *(undefined1 (*) [16])(args.ray + 0xd0),auVar67);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar85;
                auVar85 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                   *(undefined1 (*) [16])(args.ray + 0xe0),auVar67);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar85;
                auVar85 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                   *(undefined1 (*) [16])(args.ray + 0xf0),auVar67);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar85;
                auVar85 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                   *(undefined1 (*) [16])(args.ray + 0x100),auVar67);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar85;
                auVar85 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                   *(undefined1 (*) [16])(args.ray + 0x110),auVar67);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar85;
                auVar85 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                   *(undefined1 (*) [16])(args.ray + 0x120),auVar67);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar85;
                auVar85 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                   *(undefined1 (*) [16])(args.ray + 0x130),auVar67);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar85;
                auVar85 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                   *(undefined1 (*) [16])(args.ray + 0x140),auVar67);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar85;
              }
            }
            if ((_DAT_01f46b40 & auVar73) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1258._0_4_;
            }
            else {
              _local_1258 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            valid.field_0.v[uVar53] = 0.0;
            valid.field_0.i[0] = -(uint)(fVar69 <= (float)local_1258._0_4_) & valid.field_0.i[0];
            valid.field_0.i[1] = -(uint)(fVar76 <= (float)local_1258._0_4_) & valid.field_0.i[1];
            valid.field_0.i[2] = -(uint)(fVar78 <= (float)local_1258._0_4_) & valid.field_0.i[2];
            valid.field_0.i[3] = -(uint)(fVar80 <= (float)local_1258._0_4_) & valid.field_0.i[3];
            uVar42 = uVar53;
            fStack_1230 = fVar78;
            fStack_122c = fVar80;
          }
          iVar39 = movmskps((int)uVar42,(undefined1  [16])valid.field_0);
          if (iVar39 == 0) goto LAB_006f8158;
          auVar37._4_4_ = fVar76;
          auVar37._0_4_ = fVar69;
          auVar37._8_4_ = fVar78;
          auVar37._12_4_ = fVar80;
          auVar82 = blendvps(_DAT_01f45a30,auVar37,(undefined1  [16])valid.field_0);
          auVar95._4_4_ = auVar82._0_4_;
          auVar95._0_4_ = auVar82._4_4_;
          auVar95._8_4_ = auVar82._12_4_;
          auVar95._12_4_ = auVar82._8_4_;
          auVar85 = minps(auVar95,auVar82);
          auVar74._0_8_ = auVar85._8_8_;
          auVar74._8_4_ = auVar85._0_4_;
          auVar74._12_4_ = auVar85._4_4_;
          auVar85 = minps(auVar74,auVar85);
          auVar75._0_8_ =
               CONCAT44(-(uint)(auVar85._4_4_ == auVar82._4_4_) & valid.field_0._4_4_,
                        -(uint)(auVar85._0_4_ == auVar82._0_4_) & valid.field_0._0_4_);
          auVar75._8_4_ = -(uint)(auVar85._8_4_ == auVar82._8_4_) & valid.field_0._8_4_;
          auVar75._12_4_ = -(uint)(auVar85._12_4_ == auVar82._12_4_) & valid.field_0._12_4_;
          iVar39 = movmskps(iVar39,auVar75);
          aVar68 = valid.field_0;
          if (iVar39 != 0) {
            aVar68.i[2] = auVar75._8_4_;
            aVar68._0_8_ = auVar75._0_8_;
            aVar68.i[3] = auVar75._12_4_;
          }
          uVar40 = movmskps(iVar39,(undefined1  [16])aVar68);
          uVar42 = CONCAT44((int)(uVar42 >> 0x20),uVar40);
          uVar53 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
            }
          }
          goto LAB_006f82d7;
        }
      }
LAB_006f8158:
      sVar55 = sVar55 + 1;
      sVar44 = sVar55;
      uVar53 = local_11e8;
      fVar56 = local_1058;
      fVar76 = fStack_1054;
      fVar77 = fStack_1050;
      fVar78 = fStack_104c;
      fVar107 = local_1068;
      fVar79 = fStack_1064;
      fVar80 = fStack_1060;
      fVar81 = fStack_105c;
      fVar139 = local_1078;
      fVar113 = fStack_1074;
      fVar117 = fStack_1070;
      fVar89 = fStack_106c;
      fVar142 = local_1088;
      fVar96 = fStack_1084;
      fVar97 = fStack_1080;
      fVar98 = fStack_107c;
      fVar69 = local_1098;
      fVar99 = fStack_1094;
      fVar104 = fStack_1090;
      fVar105 = fStack_108c;
      fVar70 = local_10a8;
      fVar106 = fStack_10a4;
      fVar114 = fStack_10a0;
      fVar118 = fStack_109c;
      iVar39 = local_10b8;
      iVar157 = iStack_10b4;
      iVar158 = iStack_10b0;
      iVar159 = iStack_10ac;
    }
    uVar40 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar85._4_4_ = uVar40;
    auVar85._0_4_ = uVar40;
    auVar85._8_4_ = uVar40;
    auVar85._12_4_ = uVar40;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }